

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationTorque.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationTorque::IntLoadResidual_F
          (ChLinkMotorRotationTorque *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *peVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 in_register_00000034;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double c_local;
  double local_1d8;
  Vector m_abs_torque;
  ChVector<double> *local_1b8 [2];
  ChVector<double> local_1a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_190;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_160;
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  
  peVar6 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
           super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar8 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
          super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  c_local = c;
  (*peVar6->_vptr_ChFunction[4])(peVar6,CONCAT44(in_register_00000034,off));
  local_1d8 = dVar8;
  ChFrame<double>::operator>>
            (&aframe1,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame1,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body1);
  ChFrame<double>::operator>>
            (&aframe2,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                       frame2,
             (ChFrame<double> *)
             (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
             super_ChLinkMate.super_ChLink.Body2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1d8;
  auVar9 = ZEXT816(0) << 0x40;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] * 0.0;
  auVar1 = vfmadd231sd_fma(auVar10,auVar9,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] * 0.0;
  auVar2 = vfmadd231sd_fma(auVar11,auVar9,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar3 = vfmadd231sd_fma(auVar13,auVar9,auVar3);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar12,auVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar2 = vfmadd231sd_fma(auVar2,auVar12,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = aframe2.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar12,auVar5);
  m_abs_torque.m_data[0] = auVar1._0_8_;
  m_abs_torque.m_data[1] = auVar2._0_8_;
  m_abs_torque.m_data[2] = auVar3._0_8_;
  iVar7 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var,iVar7) + 0x2c) == '\0') {
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_1a8,
               (ChFrame<double> *)
               (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2,&m_abs_torque);
    local_1b8[0] = &local_1a8;
    Eigen::operator*(&local_190,&c_local,(StorageBaseType *)local_1b8);
    iVar7 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_160,R,(long)*(int *)(CONCAT44(extraout_var_00,iVar7) + 0x30) + 3,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_160,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_190);
  }
  iVar7 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
            super_ChFrame<double>._vptr_ChFrame[0x10])();
  if (*(char *)(CONCAT44(extraout_var_01,iVar7) + 0x2c) == '\0') {
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_1a8,
               (ChFrame<double> *)
               (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body1,&m_abs_torque);
    local_1b8[0] = &local_1a8;
    Eigen::operator*(&local_190,&c_local,(StorageBaseType *)local_1b8);
    iVar7 = (*(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
              super_ChFrame<double>._vptr_ChFrame[0x10])();
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_160,R,(long)*(int *)(CONCAT44(extraout_var_02,iVar7) + 0x30) + 3,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_160,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_190);
  }
  return;
}

Assistant:

void ChLinkMotorRotationTorque::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    // compute instant torque
    double mT = m_func->Get_y(this->GetChTime());

    ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
    ChFrame<> aframe2 = this->frame2 >> (*this->Body2);
    Vector m_abs_torque = aframe2.GetA() * ChVector<>(0, 0, mT);

    if (Body2->Variables().IsActive()) {
        R.segment(Body2->Variables().GetOffset() + 3, 3) -=
            c * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }

    if (Body1->Variables().IsActive()) {
        R.segment(Body1->Variables().GetOffset() + 3, 3) +=
            c * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }
}